

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

int Wlc_ObjAlloc(Wlc_Ntk_t *p,int Type,int Signed,int End,int Beg)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if ((Type == 4) || (Type == 2)) {
    __assert_fail("Type != WLC_OBJ_PO && Type != WLC_OBJ_FI",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                  ,0xca,"int Wlc_ObjAlloc(Wlc_Ntk_t *, int, int, int, int)");
  }
  uVar4 = p->iObj;
  uVar5 = p->nObjsAlloc;
  if (uVar4 == uVar5) {
    if (p->pObjs == (Wlc_Obj_t *)0x0) {
      pWVar2 = (Wlc_Obj_t *)malloc((long)(int)uVar4 * 0x30);
      uVar3 = uVar4;
    }
    else {
      pWVar2 = (Wlc_Obj_t *)realloc(p->pObjs,(long)(int)uVar4 * 0x30);
      uVar4 = p->iObj;
      uVar3 = p->nObjsAlloc;
    }
    uVar5 = uVar3 * 2;
    p->pObjs = pWVar2;
    memset(pWVar2 + (int)uVar3,0,(long)(int)uVar3 * 0x18);
    p->nObjsAlloc = uVar5;
  }
  if ((0 < (int)uVar4) && ((int)uVar4 < (int)uVar5)) {
    pWVar2 = p->pObjs;
    *(ushort *)(pWVar2 + uVar4) =
         (ushort)((Signed & 1U) << 6) | (ushort)Type & 0x3f |
         (ushort)*(undefined4 *)(pWVar2 + uVar4) & 0xff80;
    pWVar2[uVar4].End = End;
    pWVar2[uVar4].Beg = Beg;
    if (((ushort)Type & 0x3d) == 1) {
      Wlc_ObjSetCi(p,pWVar2 + uVar4);
    }
    p->nObjs[Type] = p->nObjs[Type] + 1;
    iVar1 = p->iObj;
    p->iObj = iVar1 + 1;
    return iVar1;
  }
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

int Wlc_ObjAlloc( Wlc_Ntk_t * p, int Type, int Signed, int End, int Beg )
{
    Wlc_Obj_t * pObj;
    assert( Type != WLC_OBJ_PO && Type != WLC_OBJ_FI );
    if ( p->iObj == p->nObjsAlloc )
    {
        p->pObjs = ABC_REALLOC( Wlc_Obj_t, p->pObjs, 2 * p->nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Wlc_Obj_t) * p->nObjsAlloc );
        p->nObjsAlloc *= 2;
    }
    pObj = Wlc_NtkObj( p, p->iObj );
    pObj->Type   = Type;
    pObj->Signed = Signed;
    pObj->End    = End;
    pObj->Beg    = Beg;
    if ( Wlc_ObjIsCi(pObj) )
        Wlc_ObjSetCi( p, pObj );
    p->nObjs[Type]++;
    return p->iObj++;
}